

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_iter.cc
# Opt level: O3

bool __thiscall leveldb::anon_unknown_3::DBIter::ParseKey(DBIter *this,ParsedInternalKey *ikey)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  uint uVar5;
  ValueType VVar6;
  ulong uVar7;
  uint uVar8;
  ulong extraout_RDX;
  long extraout_RDX_00;
  long in_FS_OFFSET;
  Slice key;
  Slice local_58;
  Slice local_48;
  Status local_38;
  long local_30;
  char *pcVar4;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  iVar3 = (*this->iter_->_vptr_Iterator[8])();
  pcVar4 = (char *)CONCAT44(extraout_var,iVar3);
  (*this->iter_->_vptr_Iterator[9])();
  while (uVar1 = this->bytes_until_read_sampling_, uVar1 < extraout_RDX_00 + extraout_RDX) {
    uVar7 = (ulong)(this->rnd_).seed_ * 0x41a7;
    uVar5 = (uint)uVar7 & 0x7fffffff;
    iVar3 = (int)(uVar7 >> 0x1f);
    uVar8 = iVar3 + uVar5;
    uVar5 = iVar3 + uVar5 + 0x80000001;
    if (-1 < (int)uVar8) {
      uVar5 = uVar8;
    }
    (this->rnd_).seed_ = uVar5;
    this->bytes_until_read_sampling_ = (uVar5 & 0x1fffff) + uVar1;
    key.size_ = extraout_RDX;
    key.data_ = pcVar4;
    DBImpl::RecordReadSample(this->db_,key);
  }
  this->bytes_until_read_sampling_ = uVar1 - (extraout_RDX_00 + extraout_RDX);
  if (7 < extraout_RDX) {
    VVar6 = (ValueType)*(ulong *)(pcVar4 + (extraout_RDX - 8)) & 0xff;
    ikey->sequence = *(ulong *)(pcVar4 + (extraout_RDX - 8)) >> 8;
    ikey->type = VVar6;
    (ikey->user_key).data_ = pcVar4;
    (ikey->user_key).size_ = extraout_RDX - 8;
    bVar2 = true;
    if (VVar6 < 2) goto LAB_00d17eb4;
  }
  local_48.data_ = "corrupted internal key in DBIter";
  local_48.size_ = 0x20;
  local_58.data_ = "";
  local_58.size_ = 0;
  Status::Status(&local_38,kCorruption,&local_48,&local_58);
  pcVar4 = (this->status_).state_;
  (this->status_).state_ = local_38.state_;
  local_38.state_ = pcVar4;
  if (pcVar4 != (char *)0x0) {
    operator_delete__(pcVar4);
  }
  bVar2 = false;
LAB_00d17eb4:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

inline bool DBIter::ParseKey(ParsedInternalKey* ikey) {
  Slice k = iter_->key();

  size_t bytes_read = k.size() + iter_->value().size();
  while (bytes_until_read_sampling_ < bytes_read) {
    bytes_until_read_sampling_ += RandomCompactionPeriod();
    db_->RecordReadSample(k);
  }
  assert(bytes_until_read_sampling_ >= bytes_read);
  bytes_until_read_sampling_ -= bytes_read;

  if (!ParseInternalKey(k, ikey)) {
    status_ = Status::Corruption("corrupted internal key in DBIter");
    return false;
  } else {
    return true;
  }
}